

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O1

void __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64UL>,_false,_false>::run
          (CompiledLightVm<randomx::AlignedAllocator<64UL>,_false,_false> *this,void *seed)

{
  VmBase<randomx::AlignedAllocator<64UL>,_false>::generateProgram
            ((VmBase<randomx::AlignedAllocator<64UL>,_false> *)this,seed);
  randomx_vm::initialize((randomx_vm *)this);
  JitCompilerX86::generateProgramLight
            (&(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>).compiler,
             (Program *)
             &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>).field_0x40,
             (ProgramConfiguration *)
             &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>).field_0x9c0,
             *(uint32_t *)
              &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>).field_0xa00);
  CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>::execute
            (&this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgramLight(program, config, datasetOffset);
		if (secureJit) {
			compiler.enableExecution();
		}
		CompiledVm<Allocator, softAes, secureJit>::execute();
	}